

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O3

void __thiscall
dynet::NaryTreeLSTMBuilder::NaryTreeLSTMBuilder
          (NaryTreeLSTMBuilder *this,uint N,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  uint uVar1;
  long lVar2;
  Parameter PVar3;
  LookupParameter LVar4;
  Parameter PVar5;
  ulong uVar6;
  uint v;
  uint uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ParameterCollection *this_00;
  initializer_list<dynet::Parameter> __l;
  initializer_list<dynet::LookupParameter> __l_00;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> lps;
  string local_1a8;
  NaryTreeLSTMBuilder *local_188;
  value_type local_180;
  uint local_168;
  allocator_type local_161;
  ParameterCollection *local_160;
  uint local_154;
  pointer local_150;
  ParameterCollection local_148;
  vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
  *local_a8;
  vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  *local_a0;
  ulong local_98;
  ParameterStorage *local_90;
  LookupParameterStorage *local_88;
  LookupParameterStorage *local_80;
  ParameterStorage *local_78;
  ParameterStorage *local_70;
  LookupParameterStorage *local_68;
  LookupParameterStorage *local_60;
  ParameterStorage *local_58;
  ParameterStorage *local_50;
  LookupParameterStorage *local_48;
  LookupParameterStorage *local_40;
  ParameterStorage *local_38;
  
  (this->super_TreeLSTMBuilder).super_RNNBuilder.cur = -1;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.sm.q_ = CREATED;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder._vptr_RNNBuilder =
       (_func_int **)&PTR__NaryTreeLSTMBuilder_005b95a8;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  local_a0 = &this->params;
  local_a8 = &this->lparams;
  memset(local_a0,0,0x90);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layers = layers;
  this->N = N;
  this->cg = (ComputationGraph *)0x0;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_154 = layers;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"nary-tree-lstm-builder","");
  ParameterCollection::add_subcollection(&local_148,model,&local_1a8);
  std::__cxx11::string::_M_assign((string *)this_00);
  if (&local_148 != this_00) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).name_cntr,&local_148.name_cntr._M_h);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->local_model).collec_name_cntr,&local_148.collec_name_cntr._M_h);
  }
  (this->local_model).storage = local_148.storage;
  (this->local_model).parent = local_148.parent;
  local_188 = this;
  ParameterCollection::~ParameterCollection(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if (local_154 != 0) {
    uVar7 = 0;
    local_150 = (pointer)&PTR__ParameterInit_005b8ae0;
    local_160 = this_00;
    do {
      paVar8 = &local_1a8.field_2;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      local_168 = input_dim;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_148,0.0,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_38 = PVar3.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      LVar4 = ParameterCollection::add_lookup_parameters
                        (this_00,N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_40 = LVar4.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_48 = (LookupParameterStorage *)
                 ParameterCollection::add_lookup_parameters
                           (this_00,N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_148.name.field_2._12_4_ = 1;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      local_148.name._M_dataplus._M_p._0_4_ = hidden_dim;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = local_150;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_50 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)&local_148,(ParameterInit *)&local_180,&local_1a8,
                            dynet::default_device);
      uVar1 = local_168;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_148,0.0,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_58 = PVar3.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      LVar4 = ParameterCollection::add_lookup_parameters
                        (this_00,N * N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_60 = LVar4.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_68 = (LookupParameterStorage *)
                 ParameterCollection::add_lookup_parameters
                           (this_00,N * N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_148.name.field_2._12_4_ = 1;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = local_150;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_70 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)&local_148,(ParameterInit *)&local_180,&local_1a8,
                            dynet::default_device);
      uVar1 = local_168;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_148,0.0,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_78 = PVar3.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      LVar4 = ParameterCollection::add_lookup_parameters
                        (this_00,N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_80 = LVar4.p;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_88 = (LookupParameterStorage *)
                 ParameterCollection::add_lookup_parameters
                           (this_00,N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_148.name.field_2._12_4_ = 1;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = local_150;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      local_90 = (ParameterStorage *)
                 ParameterCollection::add_parameters
                           (this_00,(Dim *)&local_148,(ParameterInit *)&local_180,&local_1a8,
                            dynet::default_device);
      uVar1 = local_168;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar1,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      local_98 = (ulong)uVar7;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      PVar3 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_148,0.0,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar8) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
      local_148.name.field_2._12_4_ = 0;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      lVar2 = 0;
      do {
        uVar6 = (ulong)(uint)local_148.name.field_2._12_4_;
        local_148.name.field_2._12_4_ = local_148.name.field_2._12_4_ + 1;
        *(undefined4 *)((long)&local_148.name._M_dataplus._M_p + uVar6 * 4) =
             *(undefined4 *)
              ((long)&local_180.
                      super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 8);
      local_1a8._M_dataplus._M_p = (pointer)paVar8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      LVar4 = ParameterCollection::add_lookup_parameters
                        (this_00,N,(Dim *)&local_148,&local_1a8,dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_148.name.field_2._12_4_ = 1;
      local_148.name_cntr._M_h._M_buckets._0_4_ = 1;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = local_150;
      local_180.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
      PVar5 = ParameterCollection::add_parameters
                        (this_00,(Dim *)&local_148,(ParameterInit *)&local_180,&local_1a8,
                         dynet::default_device);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      local_148.name._M_dataplus._M_p = (pointer)local_38;
      local_148.name._M_string_length = (size_type)local_50;
      local_148.name.field_2._M_allocated_capacity = (size_type)local_58;
      local_148.name.field_2._8_4_ = SUB84(local_70,0);
      local_148.name.field_2._12_4_ = (undefined4)((ulong)local_70 >> 0x20);
      local_148.name_cntr._M_h._M_buckets._0_4_ = SUB84(local_78,0);
      local_148.name_cntr._M_h._M_buckets._4_4_ = (undefined4)((ulong)local_78 >> 0x20);
      local_148.name_cntr._M_h._M_bucket_count = (size_type)local_90;
      __l._M_len = 8;
      __l._M_array = (iterator)&local_148;
      local_148.name_cntr._M_h._M_before_begin._M_nxt = (_Hash_node_base *)PVar3;
      local_148.name_cntr._M_h._M_element_count = (size_type)PVar5;
      std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
                ((vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&local_1a8,__l,
                 (allocator_type *)&local_180);
      this_00 = local_160;
      local_148.name._M_dataplus._M_p = (pointer)local_40;
      local_148.name._M_string_length = (size_type)local_60;
      local_148.name.field_2._M_allocated_capacity = (size_type)local_80;
      local_148.name.field_2._8_4_ = SUB84(LVar4.p,0);
      local_148.name.field_2._12_4_ = (undefined4)((ulong)LVar4.p >> 0x20);
      local_148.name_cntr._M_h._M_buckets._0_4_ = SUB84(local_48,0);
      local_148.name_cntr._M_h._M_buckets._4_4_ = (undefined4)((ulong)local_48 >> 0x20);
      local_148.name_cntr._M_h._M_bucket_count = (size_type)local_68;
      local_148.name_cntr._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_88;
      __l_00._M_len = 7;
      __l_00._M_array = (iterator)&local_148;
      std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::vector
                ((vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> *)
                 &local_180,__l_00,&local_161);
      std::
      vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
      ::push_back(local_a0,(value_type *)&local_1a8);
      uVar6 = local_98;
      std::
      vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
      ::push_back(local_a8,&local_180);
      if (local_180.
          super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.
                        super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      uVar7 = (int)uVar6 + 1;
      input_dim = hidden_dim;
    } while (uVar7 != local_154);
  }
  return;
}

Assistant:

NaryTreeLSTMBuilder::NaryTreeLSTMBuilder(unsigned N,
                         unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) : layers(layers), N(N), cg(nullptr) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("nary-tree-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // f
    Parameter p_x2f = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    LookupParameter p_c2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    Parameter p_bf = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c (a.k.a. u)
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2c = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_bi, p_x2f, p_bf, p_x2o, p_bo, p_x2c, p_bc};
    vector<LookupParameter> lps = {p_h2i, p_h2f, p_h2o, p_h2c, p_c2i, p_c2f, p_c2o};
    params.push_back(ps);
    lparams.push_back(lps);
  }  // layers
}